

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall
crnlib::mipmapped_texture::write_regular_image
          (mipmapped_texture *this,char *pFilename,uint32 image_write_flags)

{
  bool bVar1;
  image_u8 *img;
  image_u8 tmp;
  image_u8 local_48;
  
  local_48.m_width = 0;
  local_48.m_height = 0;
  local_48.m_pitch = 0;
  local_48.m_total = 0;
  local_48.m_comp_flags = 0xf;
  local_48.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
  local_48.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
  local_48.m_pixel_buf.m_size = 0;
  local_48.m_pixel_buf.m_capacity = 0;
  img = mip_level::get_unpacked_image(*((this->m_faces).m_p)->m_p,&local_48,3);
  bVar1 = image_utils::write_to_file(pFilename,img,image_write_flags,-1);
  if (!bVar1) {
    dynamic_string::set(&this->m_last_error,"File write failed",0xffffffff);
  }
  if (local_48.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
    crnlib_free(local_48.m_pixel_buf.m_p);
  }
  return bVar1;
}

Assistant:

bool mipmapped_texture::write_regular_image(const char* pFilename, uint32 image_write_flags) {
  image_u8 tmp;
  image_u8* pLevel_image = get_level_image(0, 0, tmp);

  if (!image_utils::write_to_file(pFilename, *pLevel_image, image_write_flags)) {
    set_last_error("File write failed");
    return false;
  }

  return true;
}